

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Expression * __thiscall
soul::heart::Parser::parseArraySlice
          (Parser *this,FunctionParseState *state,Expression *lhs,int64_t start,int64_t end)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Module *this_00;
  ArrayElement *lhs_00;
  Expression *pEVar3;
  unsigned_long local_70;
  CompileMessage local_68;
  
  iVar2 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
  if ((*(byte *)CONCAT44(extraout_var,iVar2) & 0xfe) != 2) {
    Errors::targetIsNotAnArray<>();
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_68);
    CompileMessage::~CompileMessage(&local_68);
  }
  iVar2 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
  bVar1 = Type::isValidArrayOrVectorRange<long>((Type *)CONCAT44(extraout_var_00,iVar2),start,end);
  if (!bVar1) {
    Errors::illegalSliceSize<>();
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_68);
    CompileMessage::~CompileMessage(&local_68);
  }
  this_00 = pool_ptr<soul::Module>::operator->(&this->module);
  local_70 = end;
  local_68.description._M_dataplus._M_p = (pointer)start;
  lhs_00 = Module::
           allocate<soul::heart::ArrayElement,soul::CodeLocation&,soul::heart::Expression&,unsigned_long,unsigned_long>
                     (this_00,&(this->
                               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                               ).location,lhs,(unsigned_long *)&local_68,&local_70);
  pEVar3 = parseSuffixOperators(this,state,&lhs_00->super_Expression);
  return pEVar3;
}

Assistant:

heart::Expression& parseArraySlice (const FunctionParseState& state, heart::Expression& lhs, int64_t start, int64_t end)
    {
        if (! lhs.getType().isArrayOrVector())
            throwError (Errors::targetIsNotAnArray());

        if (! lhs.getType().isValidArrayOrVectorRange (start, end))
            throwError (Errors::illegalSliceSize());

        auto& s = module->allocate<heart::ArrayElement> (location, lhs, (size_t) start, (size_t) end);
        return parseSuffixOperators (state, s);
    }